

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFXRefEntry.cc
# Opt level: O0

int __thiscall QPDFXRefEntry::getObjStreamNumber(QPDFXRefEntry *this)

{
  int iVar1;
  logic_error *this_00;
  QPDFXRefEntry *this_local;
  
  if (this->type != 2) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"getObjStreamNumber called for xref entry of type != 2");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  iVar1 = QIntC::to_int<long_long>(&this->field1);
  return iVar1;
}

Assistant:

int
QPDFXRefEntry::getObjStreamNumber() const
{
    if (this->type != 2) {
        throw std::logic_error("getObjStreamNumber called for xref entry of type != 2");
    }
    return QIntC::to_int(this->field1);
}